

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  MaybeStackArray<char,_30> digits;
  char buffer8 [100];
  
  MaybeStackArray<char,_30>::MaybeStackArray(&digits,this->precision + 1);
  iVar7 = this->precision;
  lVar3 = (long)iVar7;
  if (0 < lVar3) {
    iVar1 = -1;
    lVar5 = 0;
    do {
      uVar2 = iVar7 + iVar1;
      if (this->usingBytes == true) {
        if ((int)uVar2 < iVar7 && -1 < (int)uVar2) {
          bVar6 = (this->fBCD).bcdBytes.ptr[uVar2];
        }
        else {
LAB_0020fcb2:
          bVar6 = 0;
        }
      }
      else {
        if (0xf < uVar2) goto LAB_0020fcb2;
        bVar6 = (byte)((this->fBCD).bcdLong >> ((char)uVar2 * '\x04' & 0x3fU)) & 0xf;
      }
      digits.ptr[lVar5] = bVar6 + 0x30;
      lVar5 = lVar5 + 1;
      iVar7 = this->precision;
      lVar3 = (long)iVar7;
      iVar1 = iVar1 + -1;
    } while (lVar5 < lVar3);
  }
  digits.ptr[lVar3] = '\0';
  uVar4 = 999;
  if (this->lOptPos < 999) {
    uVar4 = (ulong)(uint)this->lOptPos;
  }
  uVar8 = 0xfffffc19;
  if (-999 < this->rOptPos) {
    uVar8 = (ulong)(uint)this->rOptPos;
  }
  pcVar10 = "long";
  if (this->usingBytes != false) {
    pcVar10 = "bytes";
  }
  pcVar9 = "-";
  if ((this->flags & 1U) == 0) {
    pcVar9 = "";
  }
  if (this->precision == 0) {
    digits.ptr = "0";
  }
  snprintf(buffer8,100,"<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",uVar4,(ulong)(uint)this->lReqPos,
           (ulong)(uint)this->rReqPos,uVar8,pcVar10,pcVar9,digits.ptr,"E",(ulong)(uint)this->scale);
  UnicodeString::UnicodeString(__return_storage_ptr__,buffer8,-1,kInvariant);
  MaybeStackArray<char,_30>::~MaybeStackArray(&digits);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toString() const {
    MaybeStackArray<char, 30> digits(precision + 1);
    for (int32_t i = 0; i < precision; i++) {
        digits[i] = getDigitPos(precision - i - 1) + '0';
    }
    digits[precision] = 0; // terminate buffer
    char buffer8[100];
    snprintf(
            buffer8,
            sizeof(buffer8),
            "<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",
            (lOptPos > 999 ? 999 : lOptPos),
            lReqPos,
            rReqPos,
            (rOptPos < -999 ? -999 : rOptPos),
            (usingBytes ? "bytes" : "long"),
            (isNegative() ? "-" : ""),
            (precision == 0 ? "0" : digits.getAlias()),
            "E",
            scale);
    return UnicodeString(buffer8, -1, US_INV);
}